

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

ostream * wasm::printModuleComponent(Expression *curr,ostringstream *stream,Module *wasm)

{
  undefined8 in_RAX;
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  size_t sVar4;
  ModuleExpression pair;
  undefined8 uStack_28;
  
  if (curr != (Expression *)0x0) {
    uStack_28 = in_RAX;
    lVar1 = std::ostream::tellp();
    if (lVar1 < 0x4000) {
      pair.second = curr;
      pair.first = wasm;
      poVar2 = std::operator<<((ostream *)stream,pair);
      pcVar3 = (char *)((long)&uStack_28 + 7);
      uStack_28 = CONCAT17(10,(undefined7)uStack_28);
      lVar1 = 1;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"[not printing ",0xe);
      pcVar3 = getExpressionName(curr);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,pcVar3,sVar4);
      }
      pcVar3 = " because output is already very large]\n";
      lVar1 = 0x27;
      poVar2 = (ostream *)stream;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,lVar1);
  }
  return (ostream *)stream;
}

Assistant:

inline std::ostream& printModuleComponent(Expression* curr,
                                          std::ostringstream& stream,
                                          Module& wasm) {
  if (curr) {
    // Print the full expression if we can, but avoid doing so if the output is
    // already very large. This avoids quadratic output in some cases (e.g. if
    // we have many nested expressions in each other, all of which fail to
    // validate).
    const std::ostringstream::pos_type MAX_OUTPUT = 16 * 1024;
    if (stream.tellp() < MAX_OUTPUT) {
      stream << ModuleExpression(wasm, curr) << '\n';
    } else {
      // Print something, at least.
      stream << "[not printing " << getExpressionName(curr)
             << " because output is already very large]\n";
    }
  }
  return stream;
}